

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumValueDescriptor::GetLocationPath
          (EnumValueDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  iterator iVar1;
  int local_18 [2];
  
  EnumDescriptor::GetLocationPath(this->type_,output);
  local_18[1] = 2;
  iVar1._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar1,local_18 + 1);
  }
  else {
    *iVar1._M_current = 2;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  local_18[0] = (int)((ulong)((long)this - (long)this->type_->values_) >> 4) * -0x55555555;
  iVar1._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar1,local_18);
  }
  else {
    *iVar1._M_current = local_18[0];
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void EnumValueDescriptor::GetLocationPath(std::vector<int>* output) const {
  type()->GetLocationPath(output);
  output->push_back(EnumDescriptorProto::kValueFieldNumber);
  output->push_back(index());
}